

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O3

int Abc_ResMigrate(DdManager *dd,DdNode *bFunc,int nInputs,uint *uParts,int iPart1,int iPart2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint local_7c;
  uint local_78;
  
  local_7c = uParts[iPart1];
  local_78 = uParts[iPart2];
  if ((local_78 & local_7c) != 0) {
    __assert_fail("(uParts[iPart1] & uParts[iPart2]) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                  ,0x13f,"int Abc_ResMigrate(DdManager *, DdNode *, int, unsigned int *, int, int)")
    ;
  }
  uVar3 = Abc_ResCofCount(dd,bFunc,local_7c,(int *)0x0);
  uVar1 = 0x1f;
  if (uVar3 - 1 != 0) {
    for (; uVar3 - 1 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  uVar1 = (uVar1 ^ 0xffffffe0) + 0x21;
  if (uVar3 < 2) {
    uVar1 = uVar3;
  }
  uVar4 = Abc_ResCofCount(dd,bFunc,uParts[iPart2],(int *)0x0);
  uVar2 = 0x1f;
  if (uVar4 - 1 != 0) {
    for (; uVar4 - 1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar2 = (uVar2 ^ 0xffffffe0) + 0x21;
  if (uVar4 < 2) {
    uVar2 = uVar4;
  }
  if (nInputs < 1) {
    iVar10 = 0;
  }
  else {
    iVar13 = (-1 << ((char)uVar1 - 1U & 0x1f)) + uVar3;
    iVar7 = (-1 << ((char)uVar2 - 1U & 0x1f)) + uVar4;
    iVar10 = 0;
    uVar3 = 0;
    do {
      if ((uParts[iPart1] >> (uVar3 & 0x1f) & 1) != 0) {
        uVar4 = uParts[iPart2];
        uVar11 = 0;
        do {
          uVar12 = 1 << ((byte)uVar11 & 0x1f);
          if ((uVar3 != uVar11) && ((uVar4 & uVar12) != 0)) {
            uVar12 = uVar12 | 1 << ((byte)uVar3 & 0x1f);
            uParts[iPart1] = uParts[iPart1] ^ uVar12;
            uParts[iPart2] = uParts[iPart2] ^ uVar12;
            uVar5 = Abc_ResCofCount(dd,bFunc,uParts[iPart1],(int *)0x0);
            uVar4 = 0x1f;
            if (uVar5 - 1 != 0) {
              for (; uVar5 - 1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            uVar4 = (uVar4 ^ 0xffffffe0) + 0x21;
            if (uVar5 < 2) {
              uVar4 = uVar5;
            }
            iVar8 = (-1 << ((char)uVar4 - 1U & 0x1f)) + uVar5;
            uVar6 = Abc_ResCofCount(dd,bFunc,uParts[iPart2],(int *)0x0);
            uVar5 = 0x1f;
            if (uVar6 - 1 != 0) {
              for (; uVar6 - 1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            uVar5 = (uVar5 ^ 0xffffffe0) + 0x21;
            if (uVar6 < 2) {
              uVar5 = uVar6;
            }
            iVar9 = (-1 << ((char)uVar5 - 1U & 0x1f)) + uVar6;
            if ((int)((uVar5 + uVar4) * 10000 + iVar8 * iVar8 + iVar9 * iVar9) <
                (int)((uVar2 + uVar1) * 10000 + iVar13 * iVar13 + iVar7 * iVar7)) {
              local_78 = uParts[iPart2];
              iVar10 = 1;
              local_7c = uParts[iPart1];
            }
            uParts[iPart1] = uParts[iPart1] ^ uVar12;
            uVar4 = uVar12 ^ uParts[iPart2];
            uParts[iPart2] = uVar4;
          }
          uVar11 = uVar11 + 1;
        } while (nInputs != uVar11);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != nInputs);
  }
  uParts[iPart1] = local_7c;
  uParts[iPart2] = local_78;
  return iVar10;
}

Assistant:

int Abc_ResMigrate( DdManager * dd, DdNode * bFunc, int nInputs, unsigned uParts[], int iPart1, int iPart2 )
{
    unsigned uParts2[2] = { uParts[iPart1], uParts[iPart2] };
    int i, k, CostCur, CostBest, fChange = 0;
    assert( (uParts[iPart1] & uParts[iPart2]) == 0 );
    CostBest = Abc_ResCost( dd, bFunc, uParts[iPart1], NULL, NULL ) 
             + Abc_ResCost( dd, bFunc, uParts[iPart2], NULL, NULL );
    for ( i = 0; i < nInputs; i++ )
    if ( uParts[iPart1] & (1 << i) )
    {
        for ( k = 0; k < nInputs; k++ )
        if ( uParts[iPart2] & (1 << k) )
        {
            if ( i == k )
                continue;
            uParts[iPart1] ^= (1 << i) | (1 << k);
            uParts[iPart2] ^= (1 << i) | (1 << k);
            CostCur = Abc_ResCost( dd, bFunc, uParts[iPart1], NULL, NULL ) + Abc_ResCost( dd, bFunc, uParts[iPart2], NULL, NULL );
            if ( CostCur < CostBest )
            {
                CostCur    = CostBest;
                uParts2[0] = uParts[iPart1];
                uParts2[1] = uParts[iPart2];
                fChange = 1;
            }
            uParts[iPart1] ^= (1 << i) | (1 << k);
            uParts[iPart2] ^= (1 << i) | (1 << k);
        }
    }
    uParts[iPart1] = uParts2[0];
    uParts[iPart2] = uParts2[1];
    return fChange;
}